

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

vector<quadraple,_std::allocator<quadraple>_> * __thiscall
LexicalAnalyzer::GetResult
          (vector<quadraple,_std::allocator<quadraple>_> *__return_storage_ptr__,
          LexicalAnalyzer *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  int local_28;
  int local_24;
  int i_1;
  int lineid;
  int linepos;
  int i;
  LexicalAnalyzer *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "=============================================================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Found ");
  sVar2 = std::vector<quadraple,_std::allocator<quadraple>_>::size(&this->error);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,"lexical error(s)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  lineid = 0;
  while( true ) {
    sVar2 = std::vector<quadraple,_std::allocator<quadraple>_>::size(&this->error);
    if (sVar2 <= (ulong)(long)lineid) break;
    poVar1 = std::operator<<((ostream *)&std::cout,"At line ");
    pvVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       (&this->error,(long)lineid);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pvVar3->linenumber);
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = std::operator<<(poVar1,"position ");
    pvVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       (&this->error,(long)lineid);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pvVar3->lineposition);
    poVar1 = std::operator<<(poVar1,':');
    pvVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       (&this->error,(long)lineid);
    poVar1 = std::operator<<(poVar1,(string *)&pvVar3->attributevalue);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    lineid = lineid + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "=============================================================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  i_1 = 0;
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<quadraple,_std::allocator<quadraple>_>::size(&this->result);
    if (sVar2 <= (ulong)(long)local_28) break;
    pvVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       (&this->result,(long)local_28);
    if (pvVar3->linenumber == local_24) {
      pvVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                         (&this->result,(long)local_28);
      pvVar3->lineposition = i_1;
      i_1 = i_1 + 1;
    }
    else {
      pvVar3 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                         (&this->result,(long)local_28);
      pvVar3->lineposition = 0;
      i_1 = 1;
      local_24 = local_24 + 1;
    }
    local_28 = local_28 + 1;
  }
  std::vector<quadraple,_std::allocator<quadraple>_>::vector(__return_storage_ptr__,&this->result);
  return __return_storage_ptr__;
}

Assistant:

std::vector<quadraple> LexicalAnalyzer::GetResult() {
    std::cout<<"============================================================="<<std::endl;
    std::cout<<"Found "<<error.size()<<' '<<"lexical error(s)"<<std::endl;
    for(int i=0;i<error.size();i++){
        std::cout<<"At line "<<error[i].linenumber<<' '<<"position "<<error[i].lineposition<<':'<<error[i].attributevalue<<std::endl;
    }
    std::cout<<"============================================================="<<std::endl;
    int linepos = 0, lineid = 0;
    for (int i = 0; i < result.size(); i++) {
        if (result[i].linenumber == lineid) {
            result[i].lineposition = linepos;
            ++linepos;
        } else {
            result[i].lineposition = 0;
            linepos = 1;
            ++lineid;
        }
    }
    return result;
}